

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain_of_responsibility.cc
# Opt level: O2

int __thiscall BaseHandler::handle(BaseHandler *this,int i)

{
  int iVar1;
  
  iVar1 = (**this->_vptr_BaseHandler)();
  if ((char)iVar1 != '\0') {
    iVar1 = (*this->_vptr_BaseHandler[1])(this,i);
    return iVar1;
  }
  if (this->sucessor == (BaseHandler *)0x0) {
    return 0;
  }
  iVar1 = handle(this->sucessor,i);
  return CONCAT31((int3)((uint)iVar1 >> 8),i == 1);
}

Assistant:

int handle(int i) {
    if (canHandle(i)) {
      return value(i);
    } else if (sucessor) {
      sucessor->handle(i);
    } else {
      return 0;
    }
  }